

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O2

bool __thiscall
gl4cts::GPUShaderFP64Test1::verifyErrorGenerationWhenCallingSizeMismatchedUniformFunctions
          (GPUShaderFP64Test1 *this)

{
  GPUShaderFP64Test1 *this_00;
  _uniform_function func;
  int iVar1;
  bool bVar2;
  int iVar3;
  deUint32 err;
  undefined4 extraout_var;
  char *pcVar4;
  long lVar5;
  int *piVar6;
  double *pdVar7;
  double *pdVar8;
  GPUShaderFP64Test1 *this_01;
  long lVar9;
  double double_data [16];
  undefined1 local_2d8 [384];
  int data [72];
  
  pdVar7 = (double *)&DAT_0168de90;
  pdVar8 = double_data;
  for (lVar5 = 0x10; lVar5 != 0; lVar5 = lVar5 + -1) {
    *pdVar8 = *pdVar7;
    pdVar7 = pdVar7 + 1;
    pdVar8 = pdVar8 + 1;
  }
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar3);
  piVar6 = data + 2;
  data[0] = 2;
  data[1] = this->m_po_double_uniform_location;
  data[2] = 0;
  data[3] = 3;
  data[5] = 2;
  data[6] = 4;
  data[8] = 0;
  data[9] = 5;
  data[0xb] = 2;
  data[0xc] = 6;
  data[0xe] = 0;
  data[0xf] = 7;
  data[0x11] = 2;
  data[0x12] = 0;
  data[0x13] = this->m_po_dvec2_uniform_location;
  data[0x14] = 0;
  data[0x15] = 1;
  data[0x17] = 2;
  data[0x18] = 4;
  data[0x1a] = 0;
  data[0x1b] = 5;
  data[0x1d] = 2;
  data[0x1e] = 6;
  data[0x20] = 0;
  data[0x21] = 7;
  data[0x23] = 2;
  data[0x24] = 0;
  data[0x25] = this->m_po_dvec3_uniform_location;
  data[0x26] = 0;
  data[0x27] = 1;
  data[0x29] = 2;
  data[0x2a] = 2;
  data[0x2c] = 0;
  data[0x2d] = 3;
  data[0x2f] = 2;
  data[0x30] = 6;
  data[0x32] = 0;
  data[0x33] = 7;
  data[0x35] = 2;
  data[0x36] = 0;
  data[0x37] = this->m_po_dvec4_uniform_location;
  data[0x38] = 0;
  data[0x39] = 1;
  data[0x3b] = 2;
  data[0x3c] = 2;
  data[0x3e] = 0;
  data[0x3f] = 3;
  data[0x41] = 2;
  data[0x42] = 4;
  data[0x44] = 0;
  data[0x45] = 5;
  data[4] = data[1];
  data[7] = data[1];
  data[10] = data[1];
  data[0xd] = data[1];
  data[0x10] = data[1];
  data[0x16] = data[0x13];
  data[0x19] = data[0x13];
  data[0x1c] = data[0x13];
  data[0x1f] = data[0x13];
  data[0x22] = data[0x13];
  data[0x28] = data[0x25];
  data[0x2b] = data[0x25];
  data[0x2e] = data[0x25];
  data[0x31] = data[0x25];
  data[0x34] = data[0x25];
  data[0x3a] = data[0x37];
  data[0x3d] = data[0x37];
  data[0x40] = data[0x37];
  data[0x43] = data[0x37];
  data[0x46] = data[0x37];
  data[0x47] = data[0];
  (**(code **)(lVar5 + 0x1680))(this->m_po_id);
  err = (**(code **)(lVar5 + 0x800))();
  glu::checkError(err,"glUseProgram() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0xba5);
  this_00 = (GPUShaderFP64Test1 *)(local_2d8 + 8);
  bVar2 = true;
  for (lVar9 = 0; lVar9 != 0x18; lVar9 = lVar9 + 1) {
    func = piVar6[-2];
    if (func < UNIFORM_FUNCTION_MATRIX2DV) {
      iVar3 = piVar6[-1];
      iVar1 = *piVar6;
      switch(func) {
      case UNIFORM_FUNCTION_1D:
        (**(code **)(lVar5 + 0x14d0))(0);
        break;
      case UNIFORM_FUNCTION_1DV:
        (**(code **)(lVar5 + 0x14d8))(iVar3,iVar1,double_data);
        break;
      case UNIFORM_FUNCTION_2D:
        (**(code **)(lVar5 + 0x1510))(0,0x3ff0000000000000);
        break;
      case UNIFORM_FUNCTION_2DV:
        (**(code **)(lVar5 + 0x1518))(iVar3,iVar1,double_data);
        break;
      case UNIFORM_FUNCTION_3D:
        (**(code **)(lVar5 + 0x1550))(0,0x3ff0000000000000,0x4000000000000000);
        break;
      case UNIFORM_FUNCTION_3DV:
        (**(code **)(lVar5 + 0x1558))(iVar3,iVar1,double_data);
        break;
      case UNIFORM_FUNCTION_4D:
        (**(code **)(lVar5 + 0x1590))(0,0x3ff0000000000000,0x4000000000000000,0x4008000000000000);
        break;
      case UNIFORM_FUNCTION_4DV:
        (**(code **)(lVar5 + 0x1598))(iVar3,iVar1,double_data);
      }
    }
    iVar3 = (**(code **)(lVar5 + 0x800))();
    if (iVar3 != 0x502) {
      local_2d8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      this_01 = this_00;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
      pcVar4 = getUniformFunctionString(this_01,func);
      std::operator<<((ostream *)this_00,pcVar4);
      std::operator<<((ostream *)this_00,
                      "() function did not generate GL_INVALID_OPERATION error when called for a uniform of incompatible size. (check index: "
                     );
      std::ostream::_M_insert<unsigned_long>((ulong)this_00);
      std::operator<<((ostream *)this_00,")");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_2d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
      bVar2 = false;
    }
    piVar6 = piVar6 + 3;
  }
  return bVar2;
}

Assistant:

bool GPUShaderFP64Test1::verifyErrorGenerationWhenCallingSizeMismatchedUniformFunctions()
{
	const double		  double_data[] = { 1, 2, 3, 4, 5, 6, 7, 8, 9, 10, 11, 12, 13, 14, 15, 16 };
	glw::GLenum			  error_code	= GL_NO_ERROR;
	const glw::Functions& gl			= m_context.getRenderContext().getFunctions();
	bool				  result		= true;

	const int data[] = {
		/* API function */ /* Uniform location */ /* Count (dv functions only) */
		(int)UNIFORM_FUNCTION_2D, m_po_double_uniform_location, 0, (int)UNIFORM_FUNCTION_2DV,
		m_po_double_uniform_location, 2, (int)UNIFORM_FUNCTION_3D, m_po_double_uniform_location, 0,
		(int)UNIFORM_FUNCTION_3DV, m_po_double_uniform_location, 2, (int)UNIFORM_FUNCTION_4D,
		m_po_double_uniform_location, 0, (int)UNIFORM_FUNCTION_4DV, m_po_double_uniform_location, 2,
		(int)UNIFORM_FUNCTION_1D, m_po_dvec2_uniform_location, 0, (int)UNIFORM_FUNCTION_1DV,
		m_po_dvec2_uniform_location, 2, (int)UNIFORM_FUNCTION_3D, m_po_dvec2_uniform_location, 0,
		(int)UNIFORM_FUNCTION_3DV, m_po_dvec2_uniform_location, 2, (int)UNIFORM_FUNCTION_4D,
		m_po_dvec2_uniform_location, 0, (int)UNIFORM_FUNCTION_4DV, m_po_dvec2_uniform_location, 2,
		(int)UNIFORM_FUNCTION_1D, m_po_dvec3_uniform_location, 0, (int)UNIFORM_FUNCTION_1DV,
		m_po_dvec3_uniform_location, 2, (int)UNIFORM_FUNCTION_2D, m_po_dvec3_uniform_location, 0,
		(int)UNIFORM_FUNCTION_2DV, m_po_dvec3_uniform_location, 2, (int)UNIFORM_FUNCTION_4D,
		m_po_dvec3_uniform_location, 0, (int)UNIFORM_FUNCTION_4DV, m_po_dvec3_uniform_location, 2,
		(int)UNIFORM_FUNCTION_1D, m_po_dvec4_uniform_location, 0, (int)UNIFORM_FUNCTION_1DV,
		m_po_dvec4_uniform_location, 2, (int)UNIFORM_FUNCTION_2D, m_po_dvec4_uniform_location, 0,
		(int)UNIFORM_FUNCTION_2DV, m_po_dvec4_uniform_location, 2, (int)UNIFORM_FUNCTION_3D,
		m_po_dvec4_uniform_location, 0, (int)UNIFORM_FUNCTION_3DV, m_po_dvec4_uniform_location, 2,
	};
	const unsigned int n_checks = sizeof(data) / sizeof(data[0]) / 3 /* entries per row */;

	gl.useProgram(m_po_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() call failed.");

	for (unsigned int n_check = 0; n_check < n_checks; ++n_check)
	{
		_uniform_function function		   = (_uniform_function)data[n_check * 3 + 0];
		int				  uniform_location = data[n_check * 3 + 1];
		int				  uniform_count	= data[n_check * 3 + 2];

		switch (function)
		{
		case UNIFORM_FUNCTION_1D:
			gl.uniform1d(uniform_location, 0.0);
			break;
		case UNIFORM_FUNCTION_1DV:
			gl.uniform1dv(uniform_location, uniform_count, double_data);
			break;
		case UNIFORM_FUNCTION_2D:
			gl.uniform2d(uniform_location, 0.0, 1.0);
			break;
		case UNIFORM_FUNCTION_2DV:
			gl.uniform2dv(uniform_location, uniform_count, double_data);
			break;
		case UNIFORM_FUNCTION_3D:
			gl.uniform3d(uniform_location, 0.0, 1.0, 2.0);
			break;
		case UNIFORM_FUNCTION_3DV:
			gl.uniform3dv(uniform_location, uniform_count, double_data);
			break;
		case UNIFORM_FUNCTION_4D:
			gl.uniform4d(uniform_location, 0.0, 1.0, 2.0, 3.0);
			break;
		case UNIFORM_FUNCTION_4DV:
			gl.uniform4dv(uniform_location, uniform_count, double_data);
			break;

		default:
		{
			DE_ASSERT(false);
		}
		} /* switch (function) */

		error_code = gl.getError();
		if (error_code != GL_INVALID_OPERATION)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << getUniformFunctionString(function)
							   << "() function did not generate GL_INVALID_OPERATION error when called for"
								  " a uniform of incompatible size. (check index: "
							   << n_check << ")" << tcu::TestLog::EndMessage;

			result = false;
		}
	} /* for (all checks) */

	return result;
}